

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O1

void zvgClose(void)

{
  if (ZvgIO.dmaBf1P != (uchar *)0x0) {
    free(ZvgIO.dmaBf1P);
    ZvgIO.dmaBf1P = (uchar *)0x0;
  }
  if (ZvgIO.dmaBf2P != (uchar *)0x0) {
    free(ZvgIO.dmaBf2P);
    ZvgIO.dmaBf2P = (uchar *)0x0;
  }
  if (((byte)ZvgIO.ecpFlags & 1) != 0) {
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xef);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    zvgEcpPutc(0xe0);
    if (((byte)ZvgIO.ecpFlags & 3) != 0) {
      terminate_1284();
      return;
    }
  }
  return;
}

Assistant:

void zvgClose( void)
{
	// release memory

	if (ZvgIO.dmaBf1P != 0)
	{	free( ZvgIO.dmaBf1P);
		ZvgIO.dmaBf1P = 0;
	}

	if (ZvgIO.dmaBf2P != 0)
	{	free( ZvgIO.dmaBf2P);
		ZvgIO.dmaBf2P = 0;
	}

	// if we were in the ECP mode, send a center command

	if (ZvgIO.ecpFlags & ECPF_ECP)
	{
		zvgEcpPutc( zcNOP);											// flush any possible half sent commands
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);

		// Center the beam on the CRT

		zvgEcpPutc( zcCENTER);										// send CENTER command

		zvgEcpPutc( zcNOP);											// fill buffer to flush out CENTER command
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);
		zvgEcpPutc( zcNOP);

		// Send one more NOP to allow us to wait for the CENTER command to finish

		zvgEcpPutc( zcNOP);

		zvgSetSppMode();											// go back to the compatibility mode
	}
}